

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uint *puVar5;
  slot_type *psVar6;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  size_t sVar10;
  byte bVar11;
  ctrl_t cVar12;
  ulong uVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  sVar8 = common->capacity_;
  if (sVar8 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  bVar9 = 0x80;
  if (sVar8 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *)common);
    if (1 < common->size_) {
      puVar5 = (uint *)soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                 *)common);
      bVar9 = (byte)(((ulong)*puVar5 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                     0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar11 = 1;
      goto LAB_00150f7b;
    }
  }
  bVar11 = 0;
LAB_00150f7b:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar8 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_3e = bVar11;
  CommonFields::set_capacity(common,new_capacity);
  bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,4ul,true,true,4ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar9,4,4);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if ((bVar11 | sVar8 != 1) == 1) {
    psVar6 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)common);
    uVar3 = local_58.heap.slot_array;
    if (!bVar4) {
      if (sVar8 == 1) {
        uVar13 = ((ulong)local_58.heap.control & 0xffffffff ^
                 (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
        FVar14 = find_first_non_full<void>
                           (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                   (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8
                                   | (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38);
        uVar7 = FVar14.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar7) {
LAB_00151182:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar7] = cVar12;
        pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar7 - 0xf & uVar1)] = cVar12;
        common->capacity_ = 0xffffffffffffff9c;
        psVar6[uVar7] = local_58._0_4_;
        CommonFields::set_capacity(common,uVar1);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar10 = 0;
          sVar8 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar10]) {
              uVar13 = ((ulong)*(uint *)(uVar3 + sVar10 * 4) ^ 0x457a38) * -0x234dd359734ecb13;
              FVar14 = find_first_non_full<void>
                                 (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                         (uVar13 & 0xff0000000000) >> 0x18 |
                                         (uVar13 & 0xff00000000) >> 8 | (uVar13 & 0xff000000) << 8 |
                                         (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
                                         uVar13 << 0x38);
              uVar7 = FVar14.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar7) goto LAB_00151182;
              cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar7] = cVar12;
              pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar7 - 0xf & uVar1)] = cVar12;
              common->capacity_ = 0xffffffffffffff9c;
              psVar6[uVar7] = *(slot_type *)(uVar3 + sVar10 * 4);
              CommonFields::set_capacity(common,uVar1);
              sVar8 = local_48;
            }
            sVar10 = sVar10 + 1;
          } while (sVar10 != sVar8);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<4ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,4);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }